

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::MockCodeGenerator::Generate
          (MockCodeGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  pointer pbVar1;
  undefined2 uVar2;
  uint uVar3;
  ServiceDescriptor *pSVar4;
  ushort *puVar5;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  bool bVar6;
  int iVar7;
  Edition EVar8;
  SourceCodeInfo *p;
  MessageLite *pMVar9;
  Nonnull<const_char_*> pcVar10;
  ZeroCopyOutputStream *pZVar11;
  void *pvVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Descriptor *pDVar13;
  FieldDescriptor *this_00;
  ostream *poVar14;
  LogMessage *pLVar15;
  ulong uVar16;
  Nonnull<std::string_*> pbVar17;
  Arena *pAVar18;
  AnnotationCollector *annotation_collector_00;
  undefined4 uVar19;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar20;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  size_type __rlen;
  anon_union_64_1_493b367e_for_FeatureSet_53 *paVar21;
  long lVar22;
  ExtensionSet *this_01;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __s1;
  size_type __rlen_2;
  long lVar23;
  char *pcVar24;
  ZeroCopyOutputStream *pZVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view str;
  string_view str_00;
  string_view str_01;
  FixedMapping replacements;
  string_view value;
  FixedMapping replacements_00;
  string_view value_00;
  string_view text;
  string_view begin_varname;
  string_view text_00;
  string_view begin_varname_00;
  string_view text_01;
  string_view begin_varname_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view v;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view sVar50;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  GeneratedCodeInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insert_into;
  string content;
  Version compiler_version;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratorContext *in_stack_fffffffffffffca0;
  undefined1 local_338 [48];
  string *local_308;
  string *local_300;
  undefined1 local_2f8 [48];
  undefined1 local_2c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 local_298;
  undefined1 local_278 [48];
  undefined4 local_248;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  undefined1 local_238 [152];
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_1a0;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_188;
  undefined1 local_168 [32];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_148;
  string local_128;
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *local_108;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *local_100;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_f8;
  AlphaNum local_f0;
  LogMessage local_c0;
  LogMessage local_b0;
  LogMessage local_a0;
  string local_90;
  string local_70;
  LogMessage local_50;
  AnnotationCollector local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  AlphaNum *c;
  
  local_308 = error;
  local_300 = parameter;
  sVar50 = anon_unknown_0::GetTestCase();
  if (sVar50._M_len == 0xb) {
    iVar7 = bcmp(sVar50._M_str,"low_maximum",0xb);
    if (iVar7 == 0) {
      this->maximum_edition_ = EDITION_PROTO2;
    }
  }
  else if ((sVar50._M_len == 0xc) && (iVar7 = bcmp(sVar50._M_str,"high_minimum",0xc), iVar7 == 0)) {
    this->minimum_edition_ = EDITION_99997_TEST_ONLY;
  }
  EVar8 = FileDescriptor::edition(file);
  uVar20 = extraout_RDX;
  if ((999 < (int)EVar8) && ((this->suppressed_features_ & 2) == 0)) {
    paVar21 = &file->merged_features_->field_0;
    bVar6 = internal::ExtensionSet::Has(&(paVar21->_impl_)._extensions_,pb::test);
    if (!bVar6) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xec,"features.HasExtension(pb::test)");
      sVar50._M_str = "Test features were not resolved properly";
      sVar50._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_50,sVar50);
      if (!bVar6) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
    }
    pMVar9 = internal::ExtensionSet::GetMessage
                       (&(paVar21->_impl_)._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__0058feb8);
    if (((ulong)pMVar9[1]._vptr_MessageLite & 1) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xee,"features.GetExtension(pb::test).has_file_feature()");
      str_07._M_str = "Test features were not resolved properly";
      str_07._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_238,str_07);
LAB_001b6ddb:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_238);
    }
    pDVar13 = (Descriptor *)(ulong)pb::test;
    pMVar9 = internal::ExtensionSet::GetMessage
                       (&(paVar21->_impl_)._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__0058feb8);
    if (((ulong)pMVar9[1]._vptr_MessageLite & 0x800) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
      str_08._M_str = "Test features were not resolved properly";
      str_08._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_238,str_08);
      goto LAB_001b6ddb;
    }
    uVar20 = extraout_RDX_00;
    if (0 < file->message_type_count_) {
      lVar22 = 0;
      lVar26 = 0;
      do {
        internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(&file->message_types_->super_SymbolBase + lVar22),pDVar13);
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 0xa0;
        uVar20 = extraout_RDX_01;
      } while (lVar26 < file->message_type_count_);
    }
    if (0 < file->enum_type_count_) {
      lVar22 = 0;
      lVar26 = 0;
      do {
        internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(&file->enum_types_->super_SymbolBase + lVar22),(EnumDescriptor *)pDVar13);
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 0x58;
        uVar20 = extraout_RDX_02;
      } while (lVar26 < file->enum_type_count_);
    }
    if (0 < file->extension_count_) {
      lVar22 = 0;
      lVar26 = 0;
      do {
        internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(&file->extensions_->super_SymbolBase + lVar22),(FieldDescriptor *)pDVar13);
        lVar26 = lVar26 + 1;
        lVar22 = lVar22 + 0x58;
        uVar20 = extraout_RDX_03;
      } while (lVar26 < file->extension_count_);
    }
    if (0 < file->service_count_) {
      lVar22 = 0;
      do {
        pSVar4 = file->services_;
        paVar21 = &(pSVar4[lVar22].merged_features_)->field_0;
        bVar6 = internal::ExtensionSet::Has(&(paVar21->_impl_)._extensions_,pb::test);
        if (!bVar6) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xec,"features.HasExtension(pb::test)");
          str_00._M_str = "Test features were not resolved properly";
          str_00._M_len = 0x28;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&local_b0,str_00);
          if (!bVar6) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_b0);
          }
        }
        pMVar9 = internal::ExtensionSet::GetMessage
                           (&(paVar21->_impl_)._extensions_,pb::test,
                            (MessageLite *)PTR__TestFeatures_default_instance__0058feb8);
        if (((ulong)pMVar9[1]._vptr_MessageLite & 1) == 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xee,"features.GetExtension(pb::test).has_file_feature()");
          str_05._M_str = "Test features were not resolved properly";
          str_05._M_len = 0x28;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_238,str_05);
          goto LAB_001b6ddb;
        }
        pMVar9 = internal::ExtensionSet::GetMessage
                           (&(paVar21->_impl_)._extensions_,pb::test,
                            (MessageLite *)PTR__TestFeatures_default_instance__0058feb8);
        if (((ulong)pMVar9[1]._vptr_MessageLite & 0x800) == 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
          str_06._M_str = "Test features were not resolved properly";
          str_06._M_len = 0x28;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_238,str_06);
          goto LAB_001b6ddb;
        }
        uVar20 = extraout_RDX_04;
        if (0 < pSVar4[lVar22].method_count_) {
          lVar23 = 0x48;
          lVar26 = 0;
          do {
            this_01 = (ExtensionSet *)
                      (*(long *)(&(pSVar4[lVar22].methods_)->super_SymbolBase + lVar23) + 0x10);
            bVar6 = internal::ExtensionSet::Has(this_01,pb::test);
            if (!bVar6) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0xec,"features.HasExtension(pb::test)");
              str._M_str = "Test features were not resolved properly";
              str._M_len = 0x28;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        (&local_a0,str);
              if (!bVar6) {
                absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_a0);
              }
            }
            pMVar9 = internal::ExtensionSet::GetMessage
                               (this_01,pb::test,
                                (MessageLite *)PTR__TestFeatures_default_instance__0058feb8);
            if (((ulong)pMVar9[1]._vptr_MessageLite & 1) == 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_238,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0xee,"features.GetExtension(pb::test).has_file_feature()");
              str_02._M_str = "Test features were not resolved properly";
              str_02._M_len = 0x28;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_238,str_02);
              goto LAB_001b6ddb;
            }
            pMVar9 = internal::ExtensionSet::GetMessage
                               (this_01,pb::test,
                                (MessageLite *)PTR__TestFeatures_default_instance__0058feb8);
            if (((ulong)pMVar9[1]._vptr_MessageLite & 0x800) == 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_238,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
              str_03._M_str = "Test features were not resolved properly";
              str_03._M_len = 0x28;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_238,str_03);
              goto LAB_001b6ddb;
            }
            lVar26 = lVar26 + 1;
            lVar23 = lVar23 + 0x50;
            uVar20 = extraout_RDX_05;
          } while (lVar26 < pSVar4[lVar22].method_count_);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < file->service_count_);
    }
  }
  bVar6 = 0 < file->message_type_count_;
  if (file->message_type_count_ < 1) {
    bVar28 = false;
  }
  else {
    lVar26 = 0x10;
    lVar22 = 0;
    cVar42 = 'G';
    cVar43 = 'e';
    cVar44 = 'n';
    cVar45 = 'e';
    cVar46 = 'r';
    cVar47 = 'a';
    cVar48 = 't';
    cVar49 = 'o';
    cVar34 = 'M';
    cVar35 = 'o';
    cVar36 = 'c';
    cVar37 = 'k';
    cVar38 = 'C';
    cVar39 = 'o';
    cVar40 = 'd';
    cVar41 = 'e';
    bVar28 = false;
    local_248 = 0x6b636f4d;
    cStack_244 = 'C';
    cStack_243 = 'o';
    cStack_242 = 'd';
    cStack_241 = 'e';
    cStack_240 = 'G';
    cStack_23f = 'e';
    cStack_23e = 'n';
    cStack_23d = 'e';
    cStack_23c = 'r';
    cStack_23b = 'a';
    cStack_23a = 't';
    cStack_239 = 'o';
    do {
      puVar5 = *(ushort **)(&file->message_types_->super_SymbolBase + lVar26);
      if (0x11 < (ulong)*puVar5) {
        uVar16 = ~(ulong)*puVar5;
        pcVar24 = (char *)((long)puVar5 + uVar16);
        uVar2 = *(undefined2 *)((long)puVar5 + uVar16 + 0x10);
        auVar29[0] = -(*pcVar24 == cVar34);
        auVar29[1] = -(pcVar24[1] == cVar35);
        auVar29[2] = -(pcVar24[2] == cVar36);
        auVar29[3] = -(pcVar24[3] == cVar37);
        auVar29[4] = -(pcVar24[4] == cVar38);
        auVar29[5] = -(pcVar24[5] == cVar39);
        auVar29[6] = -(pcVar24[6] == cVar40);
        auVar29[7] = -(pcVar24[7] == cVar41);
        auVar29[8] = -(pcVar24[8] == cVar42);
        auVar29[9] = -(pcVar24[9] == cVar43);
        auVar29[10] = -(pcVar24[10] == cVar44);
        auVar29[0xb] = -(pcVar24[0xb] == cVar45);
        auVar29[0xc] = -(pcVar24[0xc] == cVar46);
        auVar29[0xd] = -(pcVar24[0xd] == cVar47);
        auVar29[0xe] = -(pcVar24[0xe] == cVar48);
        auVar29[0xf] = -(pcVar24[0xf] == cVar49);
        auVar32[0] = -((char)uVar2 == 'r');
        auVar32[1] = -((char)((ushort)uVar2 >> 8) == '_');
        auVar32[2] = 0xff;
        auVar32[3] = 0xff;
        auVar32[4] = 0xff;
        auVar32[5] = 0xff;
        auVar32[6] = 0xff;
        auVar32[7] = 0xff;
        auVar32[8] = 0xff;
        auVar32[9] = 0xff;
        auVar32[10] = 0xff;
        auVar32[0xb] = 0xff;
        auVar32[0xc] = 0xff;
        auVar32[0xd] = 0xff;
        auVar32[0xe] = 0xff;
        auVar32[0xf] = 0xff;
        auVar32 = auVar32 & auVar29;
        if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
          if (lVar22 < file->message_type_count_) {
            pcVar10 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar22,(long)file->message_type_count_,
                                 "index < message_type_count()");
            cVar34 = (char)local_248;
            cVar35 = local_248._1_1_;
            cVar36 = local_248._2_1_;
            cVar37 = local_248._3_1_;
            cVar38 = cStack_244;
            cVar39 = cStack_243;
            cVar40 = cStack_242;
            cVar41 = cStack_241;
            cVar42 = cStack_240;
            cVar43 = cStack_23f;
            cVar44 = cStack_23e;
            cVar45 = cStack_23d;
            cVar46 = cStack_23c;
            cVar47 = cStack_23b;
            cVar48 = cStack_23a;
            cVar49 = cStack_239;
          }
          if (pcVar10 != (Nonnull<const_char_*>)0x0) {
            Generate();
LAB_001b68be:
            FieldDescriptorProto::FieldDescriptorProto
                      ((FieldDescriptorProto *)local_238,(Arena *)0x0);
            pDVar13 = FileDescriptor::message_type(file,(int)lVar22);
            this_00 = Descriptor::field(pDVar13,0);
            FieldDescriptor::CopyTo(this_00,(FieldDescriptorProto *)local_238);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_338,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0x110);
            str_09._M_str = "Saw json_name: ";
            str_09._M_len = 0xf;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)local_338,str_09);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      ((LogMessage *)local_338,SUB41((local_238._16_4_ & 0x10) >> 4,0));
            goto LAB_001b6b8d;
          }
          puVar5 = *(ushort **)(&file->message_types_->super_SymbolBase + lVar26);
          uVar16 = (ulong)*puVar5;
          pcVar24 = (char *)(~uVar16 + (long)puVar5);
          if ((0x11 < uVar16) &&
             (auVar30[0] = -(*pcVar24 == cVar34), auVar30[1] = -(pcVar24[1] == cVar35),
             auVar30[2] = -(pcVar24[2] == cVar36), auVar30[3] = -(pcVar24[3] == cVar37),
             auVar30[4] = -(pcVar24[4] == cVar38), auVar30[5] = -(pcVar24[5] == cVar39),
             auVar30[6] = -(pcVar24[6] == cVar40), auVar30[7] = -(pcVar24[7] == cVar41),
             auVar30[8] = -(pcVar24[8] == cVar42), auVar30[9] = -(pcVar24[9] == cVar43),
             auVar30[10] = -(pcVar24[10] == cVar44), auVar30[0xb] = -(pcVar24[0xb] == cVar45),
             auVar30[0xc] = -(pcVar24[0xc] == cVar46), auVar30[0xd] = -(pcVar24[0xd] == cVar47),
             auVar30[0xe] = -(pcVar24[0xe] == cVar48), auVar30[0xf] = -(pcVar24[0xf] == cVar49),
             auVar33[0] = -((char)*(undefined2 *)(pcVar24 + 0x10) == 'r'),
             auVar33[1] = -((char)((ushort)*(undefined2 *)(pcVar24 + 0x10) >> 8) == '_'),
             auVar33[2] = 0xff, auVar33[3] = 0xff, auVar33[4] = 0xff, auVar33[5] = 0xff,
             auVar33[6] = 0xff, auVar33[7] = 0xff, auVar33[8] = 0xff, auVar33[9] = 0xff,
             auVar33[10] = 0xff, auVar33[0xb] = 0xff, auVar33[0xc] = 0xff, auVar33[0xd] = 0xff,
             auVar33[0xe] = 0xff, auVar33[0xf] = 0xff, auVar33 = auVar33 & auVar30,
             (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff)) {
            pcVar24 = pcVar24 + 0x12;
            uVar16 = uVar16 - 0x12;
          }
          if (uVar16 == 5) {
            iVar7 = bcmp(pcVar24,"Error",5);
            bVar27 = iVar7 == 0;
          }
          else {
            bVar27 = false;
          }
          if (bVar27) {
            error = (string *)0x29;
            std::__cxx11::string::_M_replace
                      ((ulong)local_308,0,(char *)local_308->_M_string_length,0x3bfc74);
            uVar20 = extraout_RDX_06;
          }
          else {
            if (uVar16 == 5) {
              iVar7 = bcmp(pcVar24,"Abort",5);
              bVar28 = iVar7 != 0;
            }
            else {
              bVar28 = true;
              if (uVar16 == 4) {
                iVar7 = bcmp(pcVar24,"Exit",4);
                if (iVar7 == 0) {
                  poVar14 = std::operator<<((ostream *)&std::cerr,
                                            "Saw message type MockCodeGenerator_Exit.");
                  std::endl<char,std::char_traits<char>>(poVar14);
                  exit(0x7b);
                }
                bVar28 = true;
              }
            }
            if (!bVar28) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0x102,"command != \"Abort\"");
              str_01._M_str = "Saw message type MockCodeGenerator_Abort.";
              str_01._M_len = 0x29;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        (&local_c0,str_01);
              if (!bVar28) {
                absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_c0);
              }
            }
            if (uVar16 != 8) {
              if (uVar16 == 0xb) {
                iVar7 = bcmp(pcVar24,"HasJsonName",0xb);
                if (iVar7 == 0) goto LAB_001b68be;
LAB_001b670f:
                if ((uVar16 == 0x11) && (iVar7 = bcmp(pcVar24,"ShowVersionNumber",0x11), iVar7 == 0)
                   ) {
                  Version::Version((Version *)local_238,(Arena *)0x0);
                  (*context->_vptr_GeneratorContext[7])(context,(Version *)local_238);
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_338,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                             ,0x117);
                  str_11._M_str = "Saw compiler_version: ";
                  str_11._M_len = 0x16;
                  absl::lts_20250127::log_internal::LogMessage::
                  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                            ((LogMessage *)local_338,str_11);
                  local_f0.piece_._M_len =
                       CONCAT44(local_f0.piece_._M_len._4_4_,
                                local_238._36_4_ * 1000 + local_238._32_4_ * 1000000 +
                                local_238._40_4_);
                  pLVar15 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                                      ((LogMessage *)local_338,(int *)&local_f0);
                  str_12._M_str = " ";
                  str_12._M_len = 1;
                  absl::lts_20250127::log_internal::LogMessage::
                  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                            (pLVar15,str_12);
                  absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar15,(string *)(local_238._24_8_ & 0xfffffffffffffffc));
LAB_001b6b8d:
                  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                            ((LogMessageFatal *)local_338);
                }
              }
              else if (uVar16 == 0x11) {
                iVar7 = bcmp(pcVar24,"HasSourceCodeInfo",0x11);
                if (iVar7 == 0) {
                  FileDescriptorProto::FileDescriptorProto
                            ((FileDescriptorProto *)local_238,(Arena *)0x0);
                  FileDescriptor::CopySourceCodeInfoTo(file,(FileDescriptorProto *)local_238);
                  if (((SourceCodeInfo *)local_168._24_8_ == (SourceCodeInfo *)0x0 &
                      (byte)local_238._16_4_ >> 4) == 1) {
                    internal::protobuf_assumption_failed
                              ("!value || _impl_.source_code_info_ != nullptr",
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                               ,0x33e3);
                  }
                  if ((local_238._16_4_ & 0x10) == 0) {
                    bVar6 = false;
                  }
                  else {
                    if ((SourceCodeInfo *)local_168._24_8_ == (SourceCodeInfo *)0x0) {
                      local_168._24_8_ = _SourceCodeInfo_default_instance_;
                    }
                    bVar6 = 0 < *(int *)((long)&((SourceCodeInfo *)local_168._24_8_)->field_0 + 0x20
                                        );
                  }
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_338,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                             ,0x10a);
                  str_10._M_str = "Saw message type MockCodeGenerator_HasSourceCodeInfo: ";
                  str_10._M_len = 0x36;
                  absl::lts_20250127::log_internal::LogMessage::
                  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                            ((LogMessage *)local_338,str_10);
                  local_f0.piece_._M_len = CONCAT71(local_f0.piece_._M_len._1_7_,bVar6);
                  pLVar15 = absl::lts_20250127::log_internal::LogMessage::operator<<<bool,_0>
                                      ((LogMessage *)local_338,(bool *)&local_f0);
                  absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar15,(char (*) [2])0x4230f9);
                  goto LAB_001b6b8d;
                }
                goto LAB_001b670f;
              }
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_238,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                         ,0x11d);
              str_04._M_str = "Unknown MockCodeGenerator command: ";
              str_04._M_len = 0x23;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)local_238,str_04);
              v._M_str = pcVar24;
              v._M_len = uVar16;
              absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_238,v);
              goto LAB_001b6ddb;
            }
            iVar7 = bcmp(pcVar24,"Annotate",8);
            bVar28 = true;
            uVar20 = extraout_RDX_07;
            if (iVar7 != 0) goto LAB_001b670f;
          }
          cVar34 = (char)local_248;
          cVar35 = local_248._1_1_;
          cVar36 = local_248._2_1_;
          cVar37 = local_248._3_1_;
          cVar38 = cStack_244;
          cVar39 = cStack_243;
          cVar40 = cStack_242;
          cVar41 = cStack_241;
          cVar42 = cStack_240;
          cVar43 = cStack_23f;
          cVar44 = cStack_23e;
          cVar45 = cStack_23d;
          cVar46 = cStack_23c;
          cVar47 = cStack_23b;
          cVar48 = cStack_23a;
          cVar49 = cStack_239;
          if (bVar27) break;
        }
      }
      lVar22 = lVar22 + 1;
      lVar26 = lVar26 + 0xa0;
      bVar6 = lVar22 < file->message_type_count_;
    } while (lVar22 < file->message_type_count_);
  }
  if (bVar6) {
LAB_001b6584:
    bVar6 = false;
  }
  else {
    __s1._M_head_impl = (LogMessageData *)(local_300->_M_dataplus)._M_p;
    pZVar25 = (ZeroCopyOutputStream *)local_300->_M_string_length;
    if (pZVar25 < (ZeroCopyOutputStream *)0x10) {
      uVar19 = 0;
    }
    else {
      auVar31[0] = -(*(char *)__s1._M_head_impl == 'i');
      auVar31[1] = -(*(char *)((long)__s1._M_head_impl + 1) == 'n');
      auVar31[2] = -(*(char *)((long)__s1._M_head_impl + 2) == 's');
      auVar31[3] = -(*(char *)((long)__s1._M_head_impl + 3) == 'e');
      auVar31[4] = -(*(char *)((long)__s1._M_head_impl + 4) == 'r');
      auVar31[5] = -(*(char *)((long)__s1._M_head_impl + 5) == 't');
      auVar31[6] = -(*(char *)((long)__s1._M_head_impl + 6) == '_');
      auVar31[7] = -(*(char *)((long)__s1._M_head_impl + 7) == 'e');
      auVar31[8] = -(*(char *)((long)__s1._M_head_impl + 8) == 'n');
      auVar31[9] = -(*(char *)((long)__s1._M_head_impl + 9) == 'd');
      auVar31[10] = -(*(char *)((long)__s1._M_head_impl + 10) == 'l');
      auVar31[0xb] = -(*(char *)((long)__s1._M_head_impl + 0xb) == 'i');
      auVar31[0xc] = -(*(char *)((long)__s1._M_head_impl + 0xc) == 'n');
      auVar31[0xd] = -(*(char *)((long)__s1._M_head_impl + 0xd) == 'e');
      auVar31[0xe] = -(*(char *)((long)__s1._M_head_impl + 0xe) == 's');
      auVar31[0xf] = -(*(char *)((long)__s1._M_head_impl + 0xf) == '=');
      uVar19 = (undefined4)
               CONCAT71((int7)((ulong)uVar20 >> 8),
                        (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar31[0xf] >> 7) << 0xf) == 0xffff);
    }
    if ((char)uVar19 == '\0') {
      if ((pZVar25 < (ZeroCopyOutputStream *)0x7) ||
         (*(int *)((long)__s1._M_head_impl + 3) != 0x3d747265 ||
          *(int *)__s1._M_head_impl != 0x65736e69)) {
        local_f0.piece_._M_str = (this->name_)._M_dataplus._M_p;
        local_f0.piece_._M_len = (this->name_)._M_string_length;
        local_238._8_8_ = (file->name_->_M_dataplus)._M_p;
        local_238._0_8_ = file->name_->_M_string_length;
        local_338._0_8_ = &DAT_00000013;
        local_338._8_8_ = ".MockCodeGenerator.";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_2f8,(lts_20250127 *)local_238,(AlphaNum *)local_338,&local_f0,
                   (AlphaNum *)error);
        iVar7 = (*context->_vptr_GeneratorContext[2])();
        pZVar25 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar7);
        pcVar24 = ((AlphaNum *)local_2f8)->digits_;
        if ((char *)local_2f8._0_8_ != pcVar24) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
        }
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_2a8,(Arena *)0x0);
        local_40._vptr_AnnotationCollector = (_func_int **)&PTR__AnnotationCollector_00586938;
        annotation_collector_00 = (AnnotationCollector *)0x0;
        if (bVar28) {
          annotation_collector_00 = &local_40;
        }
        local_38 = &local_2a8;
        io::Printer::Printer((Printer *)local_238,pZVar25,'$',annotation_collector_00);
        c = (AlphaNum *)(local_300->_M_dataplus)._M_p;
        generator_name_01._M_str = (char *)local_300->_M_string_length;
        generator_name_01._M_len = (size_t)(this->name_)._M_dataplus._M_p;
        parameter_02._M_str = (char *)file;
        parameter_02._M_len = (size_t)c;
        GetOutputFileContent_abi_cxx11_
                  ((string *)local_338,(MockCodeGenerator *)(this->name_)._M_string_length,
                   generator_name_01,parameter_02,(FileDescriptor *)context,
                   in_stack_fffffffffffffca0);
        io::Printer::WriteRaw((Printer *)local_238,(char *)local_338._0_8_,local_338._8_8_);
        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
        }
        pbVar1 = (pointer)(local_2c8 + 0x10);
        local_2c8._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"_annotation","");
        if (bVar28) {
          text._M_str = "$p$\n";
          text._M_len = 4;
          io::Printer::Print<char[2],char[6]>
                    ((Printer *)local_238,text,(char (*) [2])0x4aec04,(char (*) [6])0x3f2b68);
          local_338._0_8_ = (char *)0x5;
          local_338._8_8_ = (long)"parent == symbol.parent_name_key().first" + 0x23;
          local_f0.piece_._M_len = local_2c8._8_8_;
          local_f0.piece_._M_str = (char *)local_2c8._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_2f8,(lts_20250127 *)local_338,&local_f0,
                     (AlphaNum *)local_2c8._8_8_);
          local_278._0_8_ = local_2f8._8_8_;
          local_278._8_8_ = local_2f8._0_8_;
          file_name._M_str = (char *)local_2f8._0_8_;
          file_name._M_len = local_2f8._8_8_;
          begin_varname._M_str = "p";
          begin_varname._M_len = 1;
          end_varname._M_str = "p";
          end_varname._M_len = 1;
          c = (AlphaNum *)0x4aec04;
          io::Printer::Annotate
                    ((Printer *)local_238,begin_varname,end_varname,file_name,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
          if ((char *)local_2f8._0_8_ != pcVar24) {
            operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
          }
        }
        io::Printer::WriteRaw
                  ((Printer *)local_238,
                   "# @@protoc_insertion_point(first_mock_insertion_point) is here\n",0x3f);
        if (bVar28) {
          text_00._M_str = "$p$\n";
          text_00._M_len = 4;
          io::Printer::Print<char[2],char[7]>
                    ((Printer *)local_238,text_00,(char (*) [2])0x4aec04,(char (*) [7])0x3f2b3e);
          local_338._0_8_ = &DAT_00000006;
          local_338._8_8_ = (long)"name == symbol.parent_name_key().second" + 0x21;
          local_f0.piece_._M_len = local_2c8._8_8_;
          local_f0.piece_._M_str = (char *)local_2c8._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_2f8,(lts_20250127 *)local_338,&local_f0,
                     (AlphaNum *)local_2c8._8_8_);
          local_278._0_8_ = local_2f8._8_8_;
          local_278._8_8_ = local_2f8._0_8_;
          file_name_00._M_str = (char *)local_2f8._0_8_;
          file_name_00._M_len = local_2f8._8_8_;
          begin_varname_00._M_str = "p";
          begin_varname_00._M_len = 1;
          end_varname_00._M_str = "p";
          end_varname_00._M_len = 1;
          c = (AlphaNum *)0x4aec04;
          io::Printer::Annotate
                    ((Printer *)local_238,begin_varname_00,end_varname_00,file_name_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
          if ((char *)local_2f8._0_8_ != pcVar24) {
            operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
          }
        }
        io::Printer::WriteRaw
                  ((Printer *)local_238,
                   "  # @@protoc_insertion_point(second_mock_insertion_point) is here\n",0x42);
        if (bVar28) {
          text_01._M_str = "$p$\n";
          text_01._M_len = 4;
          io::Printer::Print<char[2],char[6]>
                    ((Printer *)local_238,text_01,(char (*) [2])0x4aec04,(char (*) [6])"third");
          local_338._0_8_ = (char *)0x5;
          local_338._8_8_ = "third";
          local_f0.piece_._M_len = local_2c8._8_8_;
          local_f0.piece_._M_str = (char *)local_2c8._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_2f8,(lts_20250127 *)local_338,&local_f0,
                     (AlphaNum *)local_2c8._8_8_);
          local_278._0_8_ = local_2f8._8_8_;
          local_278._8_8_ = local_2f8._0_8_;
          file_name_01._M_str = (char *)local_2f8._0_8_;
          file_name_01._M_len = local_2f8._8_8_;
          begin_varname_01._M_str = "p";
          begin_varname_01._M_len = 1;
          end_varname_01._M_str = "p";
          end_varname_01._M_len = 1;
          c = (AlphaNum *)0x4aec04;
          io::Printer::Annotate
                    ((Printer *)local_238,begin_varname_01,end_varname_01,file_name_01,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
          if ((char *)local_2f8._0_8_ != pcVar24) {
            operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
          }
        }
        if ((bool)local_238[0x71] == true) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_308,0,(char *)local_308->_M_string_length,0x3bfde3);
        }
        else {
          if (!bVar28) {
LAB_001b664d:
            if ((pointer)local_2c8._0_8_ != pbVar1) {
              operator_delete((void *)local_2c8._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_2c8._16_8_)->_M_p + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_128);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::~raw_hash_set(&local_148);
            (*(code *)local_168._16_8_)(1,local_168);
            std::
            vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ::~vector(&local_188);
            std::
            vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ::~vector(&local_1a0);
            if ((pointer)local_238._128_8_ != (pointer)0x0) {
              operator_delete((void *)local_238._128_8_,local_238._144_8_ - local_238._128_8_);
            }
            if (local_238._16_8_ != 0) {
              (*(*(_func_int ***)local_238._0_8_)[3])();
            }
            GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_2a8);
            if (pZVar25 == (ZeroCopyOutputStream *)0x0) {
              return true;
            }
            (*pZVar25->_vptr_ZeroCopyOutputStream[1])(pZVar25);
            return true;
          }
          local_2f8._8_8_ = (this->name_)._M_dataplus._M_p;
          local_2f8._0_8_ = (this->name_)._M_string_length;
          local_338._8_8_ = (file->name_->_M_dataplus)._M_p;
          local_338._0_8_ = file->name_->_M_string_length;
          local_f0.piece_._M_len = (size_t)&DAT_00000013;
          local_f0.piece_._M_str = ".MockCodeGenerator.";
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_90,(lts_20250127 *)local_338,&local_f0,(AlphaNum *)local_2f8,c);
          local_278._0_8_ = local_90._M_string_length;
          local_278._8_8_ = local_90._M_dataplus._M_p;
          local_338._0_8_ = (char *)0x8;
          local_338._8_8_ = (long)"MockCodeGenerator couldn\'t write .pb.meta" + 0x21;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_70,(lts_20250127 *)local_278,(AlphaNum *)local_338,
                     (AlphaNum *)local_90._M_string_length);
          iVar7 = (*context->_vptr_GeneratorContext[2])(context,&local_70);
          pZVar11 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          bVar6 = TextFormat::Print((Message *)&local_2a8,pZVar11);
          if (bVar6) {
            if (pZVar11 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar11->_vptr_ZeroCopyOutputStream[1])(pZVar11);
            }
            goto LAB_001b664d;
          }
          std::__cxx11::string::operator=
                    ((string *)local_308,"MockCodeGenerator couldn\'t write .pb.meta");
          if (pZVar11 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar11->_vptr_ZeroCopyOutputStream[1])(pZVar11);
          }
          if (bVar6) goto LAB_001b664d;
        }
        if ((pointer)local_2c8._0_8_ != pbVar1) {
          operator_delete((void *)local_2c8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_2c8._16_8_)->_M_p + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_128);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::~raw_hash_set(&local_148);
        (*(code *)local_168._16_8_)(1,local_168);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(&local_188);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(&local_1a0);
        if ((pointer)local_238._128_8_ != (pointer)0x0) {
          operator_delete((void *)local_238._128_8_,local_238._144_8_ - local_238._128_8_);
        }
        if (local_238._16_8_ != 0) {
          (*(*(_func_int ***)local_238._0_8_)[3])();
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_2a8);
        if (pZVar25 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar25->_vptr_ZeroCopyOutputStream[1])(pZVar25);
        }
        goto LAB_001b6584;
      }
      pcVar24 = "insert=";
    }
    else {
      pcVar24 = "insert_endlines=";
    }
    local_248 = uVar19;
    pZVar11 = (ZeroCopyOutputStream *)strlen(pcVar24);
    if ((pZVar11 == (ZeroCopyOutputStream *)0x0) ||
       ((pZVar11 <= pZVar25 && (iVar7 = bcmp(__s1._M_head_impl,pcVar24,(size_t)pZVar11), iVar7 == 0)
        ))) {
      __s1._M_head_impl =
           (LogMessageData *)((long)&pZVar11->_vptr_ZeroCopyOutputStream + (long)__s1._M_head_impl);
      pZVar25 = (ZeroCopyOutputStream *)((long)pZVar25 - (long)pZVar11);
    }
    local_238[0x10] = 0x2c;
    local_238._0_8_ = pZVar25;
    local_238._8_8_ = __s1;
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c8,
                 (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_338,
                 (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_238);
    if (local_2c8._8_8_ != local_2c8._0_8_) {
      local_300 = &local_128;
      local_f8 = &local_148;
      local_100 = &local_188;
      local_108 = &local_1a0;
      lVar22 = 8;
      uVar16 = 0;
      do {
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_2f8,(Arena *)0x0);
        generator_name._M_str = (char *)0xc;
        generator_name._M_len = (size_t)(this->name_)._M_dataplus._M_p;
        pbVar17 = (Nonnull<std::string_*>)0xc;
        parameter_00._M_str = (char *)file;
        parameter_00._M_len = (size_t)"first_insert";
        pcVar24 = "first_insert";
        GetOutputFileContent_abi_cxx11_
                  ((string *)&local_2a8,(MockCodeGenerator *)(this->name_)._M_string_length,
                   generator_name,parameter_00,(FileDescriptor *)context,in_stack_fffffffffffffca0);
        if ((char)local_248 != '\0') {
          local_238._0_8_ = (ZeroCopyOutputStream *)0x1;
          local_238._8_8_ = (long)"-+," + 2;
          local_238._16_8_ = (int *)0x2;
          local_238._24_8_ = ",\n";
          replacements._M_len = (size_type)&local_2a8;
          replacements._M_array = (iterator)0x1;
          absl::lts_20250127::StrReplaceAll((lts_20250127 *)local_238,replacements,pbVar17);
        }
        if (bVar28) {
          pvVar12 = internal::RepeatedPtrFieldBase::AddMessageLite
                              ((RepeatedPtrFieldBase *)((AlphaNum *)local_2f8)->digits_,
                               Arena::
                               DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
          *(undefined4 *)((long)pvVar12 + 0x38) = 0;
          uVar3 = *(uint *)((long)pvVar12 + 0x10);
          *(uint *)((long)pvVar12 + 0x10) = uVar3 | 2;
          *(undefined4 *)((long)pvVar12 + 0x3c) = local_2a8._8_4_;
          *(uint *)((long)pvVar12 + 0x10) = uVar3 | 7;
          pAVar18 = *(Arena **)((long)pvVar12 + 8);
          if (((ulong)pAVar18 & 1) != 0) {
            pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
          }
          value._M_str = "first_path";
          value._M_len = 10;
          internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar12 + 0x30),value,pAVar18);
        }
        local_f0.piece_._M_str = *(char **)((char *)(local_2c8._0_8_ + 0x10) + lVar22 + -0x18);
        local_f0.piece_._M_len = *(size_t *)((char *)(local_2c8._0_8_ + 0x10) + lVar22 + -0x10);
        local_238._8_8_ = (file->name_->_M_dataplus)._M_p;
        local_238._0_8_ = file->name_->_M_string_length;
        local_338._0_8_ = &DAT_00000013;
        local_338._8_8_ = ".MockCodeGenerator.";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_278,(lts_20250127 *)local_238,(AlphaNum *)local_338,&local_f0,
                   (AlphaNum *)pcVar24);
        local_238._0_8_ = local_238 + 0x10;
        local_338._0_8_ = (int *)0x1a;
        local_238._0_8_ = std::__cxx11::string::_M_create((ulong *)local_238,(ulong)local_338);
        local_238._16_8_ = local_338._0_8_;
        builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_238._0_8_ + 8))->
                                        _vptr_ZeroCopyOutputStream + 2),"_inserti",8);
        builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_238._0_8_ + 0x10))->
                                        _vptr_ZeroCopyOutputStream + 2),"on_point",8);
        ((ZeroCopyOutputStream *)local_238._0_8_)->_vptr_ZeroCopyOutputStream =
             (_func_int **)0x6f6d5f7473726966;
        ((ZeroCopyOutputStream *)(local_238._0_8_ + 8))->_vptr_ZeroCopyOutputStream =
             (_func_int **)0x7265736e695f6b63;
        local_238._8_8_ = local_338._0_8_;
        *(char *)((long)&((ZeroCopyOutputStream *)local_238._0_8_)->_vptr_ZeroCopyOutputStream +
                 local_338._0_8_) = '\0';
        iVar7 = (*context->_vptr_GeneratorContext[5])(context,local_278,(Printer *)local_238);
        pZVar25 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar7);
        if ((ZeroCopyOutputStream *)local_238._0_8_ != (ZeroCopyOutputStream *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        if ((AlphaNum *)local_278._0_8_ != (AlphaNum *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        io::Printer::Printer((Printer *)local_238,pZVar25,'$',(AnnotationCollector *)0x0);
        io::Printer::WriteRaw
                  ((Printer *)local_238,(char *)local_2a8._M_allocated_capacity,
                   CONCAT44(local_2a8._12_4_,local_2a8._8_4_));
        if ((bool)local_238[0x71] == true) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_308,0,(char *)local_308->_M_string_length,0x3bfde3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::~raw_hash_set(&local_148);
          (*(code *)local_168._16_8_)(1,local_168);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(&local_188);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(&local_1a0);
          if ((pointer)local_238._128_8_ != (pointer)0x0) {
            operator_delete((void *)local_238._128_8_,local_238._144_8_ - local_238._128_8_);
          }
          if ((int *)local_238._16_8_ != (int *)0x0) {
            (*(*(_func_int ***)local_238._0_8_)[3])();
          }
LAB_001b653a:
          if (pZVar25 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar25->_vptr_ZeroCopyOutputStream[1])(pZVar25);
          }
          if ((anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)local_2a8._M_allocated_capacity !=
              &local_298) {
            operator_delete((void *)local_2a8._M_allocated_capacity,
                            (long)local_298._impl_.annotation_.super_RepeatedPtrFieldBase.
                                  tagged_rep_or_elem_ + 1);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_2f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2c8);
          goto LAB_001b6584;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_300);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::~raw_hash_set(local_f8);
        (*(code *)local_168._16_8_)(1,local_168,local_168);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(local_100);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(local_108);
        if ((pointer)local_238._128_8_ != (pointer)0x0) {
          operator_delete((void *)local_238._128_8_,local_238._144_8_ - local_238._128_8_);
        }
        if ((int *)local_238._16_8_ != (int *)0x0) {
          (*(*(_func_int ***)local_238._0_8_)[3])();
        }
        if (pZVar25 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar25->_vptr_ZeroCopyOutputStream[1])(pZVar25);
        }
        if ((anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)local_2a8._M_allocated_capacity !=
            &local_298) {
          operator_delete((void *)local_2a8._M_allocated_capacity,
                          (long)local_298._impl_.annotation_.super_RepeatedPtrFieldBase.
                                tagged_rep_or_elem_ + 1);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_2f8);
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_2f8,(Arena *)0x0);
        generator_name_00._M_str = (char *)0xd;
        generator_name_00._M_len = (size_t)(this->name_)._M_dataplus._M_p;
        pbVar17 = (Nonnull<std::string_*>)0xd;
        parameter_01._M_str = (char *)file;
        parameter_01._M_len = (size_t)"second_insert";
        pcVar24 = "second_insert";
        GetOutputFileContent_abi_cxx11_
                  ((string *)&local_2a8,(MockCodeGenerator *)(this->name_)._M_string_length,
                   generator_name_00,parameter_01,(FileDescriptor *)context,
                   in_stack_fffffffffffffca0);
        if ((char)local_248 != '\0') {
          local_238._0_8_ = (ZeroCopyOutputStream *)0x1;
          local_238._8_8_ = ",";
          local_238._16_8_ = (int *)0x2;
          local_238._24_8_ = ",\n";
          replacements_00._M_len = (size_type)&local_2a8;
          replacements_00._M_array = (iterator)0x1;
          absl::lts_20250127::StrReplaceAll((lts_20250127 *)local_238,replacements_00,pbVar17);
        }
        if (bVar28) {
          pvVar12 = internal::RepeatedPtrFieldBase::AddMessageLite
                              ((RepeatedPtrFieldBase *)((AlphaNum *)local_2f8)->digits_,
                               Arena::
                               DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
          *(undefined4 *)((long)pvVar12 + 0x38) = 0;
          uVar3 = *(uint *)((long)pvVar12 + 0x10);
          *(uint *)((long)pvVar12 + 0x10) = uVar3 | 2;
          *(undefined4 *)((long)pvVar12 + 0x3c) = local_2a8._8_4_;
          *(uint *)((long)pvVar12 + 0x10) = uVar3 | 7;
          pAVar18 = *(Arena **)((long)pvVar12 + 8);
          if (((ulong)pAVar18 & 1) != 0) {
            pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
          }
          value_00._M_str = "second_path";
          value_00._M_len = 0xb;
          internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar12 + 0x30),value_00,pAVar18);
        }
        local_f0.piece_._M_str = *(char **)((char *)(local_2c8._0_8_ + 0x10) + lVar22 + -0x18);
        local_f0.piece_._M_len = *(size_t *)((char *)(local_2c8._0_8_ + 0x10) + lVar22 + -0x10);
        local_238._8_8_ = (file->name_->_M_dataplus)._M_p;
        local_238._0_8_ = file->name_->_M_string_length;
        local_338._0_8_ = &DAT_00000013;
        local_338._8_8_ = ".MockCodeGenerator.";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_278,(lts_20250127 *)local_238,(AlphaNum *)local_338,&local_f0,
                   (AlphaNum *)pcVar24);
        local_238._0_8_ = local_238 + 0x10;
        local_338._0_8_ = (int *)0x1b;
        local_238._0_8_ = std::__cxx11::string::_M_create((ulong *)local_238,(ulong)local_338);
        local_238._16_8_ = local_338._0_8_;
        builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_238._0_8_ + 8))->
                                        _vptr_ZeroCopyOutputStream + 3),"_inserti",8);
        builtin_strncpy((char *)((long)&((ZeroCopyOutputStream *)(local_238._0_8_ + 0x10))->
                                        _vptr_ZeroCopyOutputStream + 3),"on_point",8);
        ((ZeroCopyOutputStream *)local_238._0_8_)->_vptr_ZeroCopyOutputStream =
             (_func_int **)0x6d5f646e6f636573;
        ((ZeroCopyOutputStream *)(local_238._0_8_ + 8))->_vptr_ZeroCopyOutputStream =
             (_func_int **)0x65736e695f6b636f;
        local_238._8_8_ = local_338._0_8_;
        *(char *)((long)&((ZeroCopyOutputStream *)local_238._0_8_)->_vptr_ZeroCopyOutputStream +
                 local_338._0_8_) = '\0';
        iVar7 = (*context->_vptr_GeneratorContext[5])(context,local_278,(Printer *)local_238);
        pZVar25 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar7);
        if ((ZeroCopyOutputStream *)local_238._0_8_ != (ZeroCopyOutputStream *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        if ((AlphaNum *)local_278._0_8_ != (AlphaNum *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        io::Printer::Printer((Printer *)local_238,pZVar25,'$',(AnnotationCollector *)0x0);
        io::Printer::WriteRaw
                  ((Printer *)local_238,(char *)local_2a8._M_allocated_capacity,
                   CONCAT44(local_2a8._12_4_,local_2a8._8_4_));
        if ((bool)local_238[0x71] == true) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_308,0,(char *)local_308->_M_string_length,0x3bfde3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::~raw_hash_set(&local_148);
          (*(code *)local_168._16_8_)(1,local_168);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(&local_188);
          std::
          vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
          ::~vector(&local_1a0);
          if ((pointer)local_238._128_8_ != (pointer)0x0) {
            operator_delete((void *)local_238._128_8_,local_238._144_8_ - local_238._128_8_);
          }
          if ((int *)local_238._16_8_ != (int *)0x0) {
            (*(*(_func_int ***)local_238._0_8_)[3])();
          }
          goto LAB_001b653a;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_300);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::~raw_hash_set(local_f8);
        (*(code *)local_168._16_8_)(1,local_168,local_168);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(local_100);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(local_108);
        if ((pointer)local_238._128_8_ != (pointer)0x0) {
          operator_delete((void *)local_238._128_8_,local_238._144_8_ - local_238._128_8_);
        }
        if ((int *)local_238._16_8_ != (int *)0x0) {
          (*(*(_func_int ***)local_238._0_8_)[3])();
        }
        if (pZVar25 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar25->_vptr_ZeroCopyOutputStream[1])(pZVar25);
        }
        if ((anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)local_2a8._M_allocated_capacity !=
            &local_298) {
          operator_delete((void *)local_2a8._M_allocated_capacity,
                          (long)local_298._impl_.annotation_.super_RepeatedPtrFieldBase.
                                tagged_rep_or_elem_ + 1);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_2f8);
        uVar16 = uVar16 + 1;
        lVar22 = lVar22 + 0x20;
      } while (uVar16 < (ulong)((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool MockCodeGenerator::Generate(const FileDescriptor* file,
                                 const std::string& parameter,
                                 GeneratorContext* context,
                                 std::string* error) const {
  // Override minimum/maximum after generating the pool to simulate a plugin
  // that "works" but doesn't advertise support of the current edition.
  absl::string_view test_case = GetTestCase();
  if (test_case == "high_minimum") {
    minimum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (test_case == "low_maximum") {
    maximum_edition_ = Edition::EDITION_PROTO2;
  }

  if (GetEdition(*file) >= Edition::EDITION_2023 &&
      (suppressed_features_ & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
    internal::VisitDescriptors(*file, [&](const auto& descriptor) {
      const FeatureSet& features = GetResolvedSourceFeatures(descriptor);
      ABSL_CHECK(features.HasExtension(pb::test))
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_file_feature())
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_source_feature())
          << "Test features were not resolved properly";
    });
  }

  bool annotate = false;
  for (int i = 0; i < file->message_type_count(); i++) {
    if (absl::StartsWith(file->message_type(i)->name(), "MockCodeGenerator_")) {
      absl::string_view command = absl::StripPrefix(
          file->message_type(i)->name(), "MockCodeGenerator_");
      if (command == "Error") {
        *error = "Saw message type MockCodeGenerator_Error.";
        return false;
      }
      if (command == "Exit") {
        std::cerr << "Saw message type MockCodeGenerator_Exit." << std::endl;
        exit(123);
      }
      ABSL_CHECK(command != "Abort")
          << "Saw message type MockCodeGenerator_Abort.";
      if (command == "HasSourceCodeInfo") {
        FileDescriptorProto file_descriptor_proto;
        file->CopySourceCodeInfoTo(&file_descriptor_proto);
        bool has_source_code_info =
            file_descriptor_proto.has_source_code_info() &&
            file_descriptor_proto.source_code_info().location_size() > 0;
        ABSL_LOG(FATAL)
            << "Saw message type MockCodeGenerator_HasSourceCodeInfo: "
            << has_source_code_info << ".";
      } else if (command == "HasJsonName") {
        FieldDescriptorProto field_descriptor_proto;
        file->message_type(i)->field(0)->CopyTo(&field_descriptor_proto);
        ABSL_LOG(FATAL) << "Saw json_name: "
                        << field_descriptor_proto.has_json_name();
      } else if (command == "Annotate") {
        annotate = true;
      } else if (command == "ShowVersionNumber") {
        Version compiler_version;
        context->GetCompilerVersion(&compiler_version);
        ABSL_LOG(FATAL) << "Saw compiler_version: "
                        << compiler_version.major() * 1000000 +
                               compiler_version.minor() * 1000 +
                               compiler_version.patch()
                        << " " << compiler_version.suffix();
      } else {
        ABSL_LOG(FATAL) << "Unknown MockCodeGenerator command: " << command;
      }
    }
  }

  bool insert_endlines = absl::StartsWith(parameter, "insert_endlines=");
  if (insert_endlines || absl::StartsWith(parameter, "insert=")) {
    std::vector<std::string> insert_into = absl::StrSplit(
        absl::StripPrefix(parameter,
                          insert_endlines ? "insert_endlines=" : "insert="),
        ',', absl::SkipEmpty());

    for (size_t i = 0; i < insert_into.size(); i++) {
      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "first_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("first_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kFirstInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }

      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "second_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("second_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kSecondInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(GetOutputFileName(name_, file)));

    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(output.get(), '$',
                        annotate ? &annotation_collector : nullptr);
    printer.PrintRaw(GetOutputFileContent(name_, parameter, file, context));
    std::string annotate_suffix = "_annotation";
    if (annotate) {
      printer.Print("$p$\n", "p", "first");
      printer.Annotate("p", absl::StrCat("first", annotate_suffix));
    }
    printer.PrintRaw(kFirstInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "second");
      printer.Annotate("p", absl::StrCat("second", annotate_suffix));
    }
    printer.PrintRaw(kSecondInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "third");
      printer.Annotate("p", absl::StrCat("third", annotate_suffix));
    }

    if (printer.failed()) {
      *error = "MockCodeGenerator detected write error.";
      return false;
    }
    if (annotate) {
      std::unique_ptr<io::ZeroCopyOutputStream> meta_output(context->Open(
          absl::StrCat(GetOutputFileName(name_, file), ".pb.meta")));
      if (!TextFormat::Print(annotations, meta_output.get())) {
        *error = "MockCodeGenerator couldn't write .pb.meta";
        return false;
      }
    }
  }

  return true;
}